

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

int run_using_server_starter(char *h2o_cmd,char *config_file)

{
  size_t sVar1;
  h2o_context_t *phVar2;
  listener_config_t *plVar3;
  h2o_multithread_queue_t *phVar4;
  h2o_filecache_t *cache;
  anon_struct_968_4_e2476a95 *paVar5;
  FILE *__stream;
  void *__argv;
  uint uVar6;
  int iVar7;
  char *pcVar8;
  size_t sVar9;
  size_t sVar10;
  int *piVar11;
  char *pcVar12;
  h2o_evloop_t *phVar13;
  pthread_t pVar14;
  h2o_socket_t *phVar15;
  ulong new_capacity;
  size_t sVar16;
  listener_ctx_t *plVar17;
  h2o_socket_t **pphVar18;
  SSL_CTX *pSVar19;
  h2o_hostconf_t **pphVar20;
  char *unaff_R14;
  listener_ctx_t *listeners;
  h2o_iovec_t hVar21;
  anon_struct_24_3_c0c47172 args;
  char host [1025];
  undefined8 uStackY_528;
  listener_ctx_t lStackY_520;
  char *pcStackY_4f0;
  listener_config_t *plStackY_4e8;
  code *pcStackY_4e0;
  h2o_vector_t local_4c8;
  char *local_4a8;
  char *local_4a0;
  char local_498 [32];
  h2o_iovec_t local_478;
  char *local_468;
  size_t local_460;
  h2o_iovec_t local_458;
  char *local_448;
  size_t local_440;
  h2o_socket_t local_438 [10];
  
  local_4c8.entries = (char **)0x0;
  local_4c8.size = 0;
  local_4c8.capacity = 0;
  pcStackY_4e0 = (code *)0x18df5d;
  local_4a8 = h2o_cmd;
  local_4a0 = config_file;
  h2o_vector__expand((h2o_mem_pool_t *)0x0,&local_4c8,8,1);
  pcStackY_4e0 = (code *)0x18df69;
  pcVar8 = h2o_configurator_get_cmd_path("share/h2o/start_server");
  sVar16 = local_4c8.size + 1;
  *(char **)((long)local_4c8.entries + local_4c8.size * 8) = pcVar8;
  if (conf.pid_file != (char *)0x0) {
    new_capacity = local_4c8.size + 2;
    local_4c8.size = sVar16;
    if (local_4c8.capacity < new_capacity) {
      pcStackY_4e0 = (code *)0x18dfa6;
      h2o_vector__expand((h2o_mem_pool_t *)0x0,&local_4c8,8,new_capacity);
    }
    unaff_R14 = conf.pid_file;
    local_458.base = "--pid-file=";
    local_458.len = 0xb;
    pcStackY_4e0 = (code *)0x18dfcf;
    local_440 = strlen(conf.pid_file);
    local_448 = unaff_R14;
    pcStackY_4e0 = (code *)0x18dfe6;
    hVar21 = h2o_concat_list((h2o_mem_pool_t *)0x0,&local_458,2);
    *(char **)((long)local_4c8.entries + local_4c8.size * 8) = hVar21.base;
    sVar16 = local_4c8.size + 1;
  }
  local_4c8.size = sVar16;
  if (conf.error_log != (char *)0x0) {
    if (local_4c8.capacity < local_4c8.size + 1) {
      pcStackY_4e0 = (code *)0x18e027;
      h2o_vector__expand((h2o_mem_pool_t *)0x0,&local_4c8,8,local_4c8.size + 1);
    }
    unaff_R14 = conf.error_log;
    local_478.base = "--log-file=";
    local_478.len = 0xb;
    pcStackY_4e0 = (code *)0x18e04d;
    local_460 = strlen(conf.error_log);
    local_468 = unaff_R14;
    pcStackY_4e0 = (code *)0x18e064;
    hVar21 = h2o_concat_list((h2o_mem_pool_t *)0x0,&local_478,2);
    *(char **)((long)local_4c8.entries + local_4c8.size * 8) = hVar21.base;
    local_4c8.size = local_4c8.size + 1;
  }
  if (conf.run_mode == RUN_MODE_DAEMON) {
    if (local_4c8.capacity < local_4c8.size + 1) {
      pcStackY_4e0 = (code *)0x18e0a4;
      h2o_vector__expand((h2o_mem_pool_t *)0x0,&local_4c8,8,local_4c8.size + 1);
    }
    *(char **)((long)local_4c8.entries + local_4c8.size * 8) = "--daemonize";
    local_4c8.size = local_4c8.size + 1;
  }
  if (conf.num_listeners != 0) {
    sVar16 = 0;
    do {
      plVar3 = conf.listeners[sVar16];
      if ((plVar3->addr).ss_family == 1) {
        pcVar8 = (plVar3->addr).__ss_padding;
        pcStackY_4e0 = (code *)0x18e105;
        sVar9 = strlen(pcVar8);
        pcStackY_4e0 = (code *)0x18e10e;
        unaff_R14 = (char *)malloc(sVar9 + 8);
        if (unaff_R14 == (char *)0x0) {
LAB_0018e308:
          pcStackY_4e0 = (code *)0x18e314;
          h2o__fatal(
                    "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/include/h2o/memory.h:330:no memory"
                    );
        }
        pcStackY_4e0 = (code *)0x18e12e;
        sprintf(unaff_R14,"--path=%s",pcVar8);
      }
      else {
        pcStackY_4e0 = (code *)0x18e15e;
        uVar6 = getnameinfo((sockaddr *)&conf.listeners[sVar16]->addr,
                            conf.listeners[sVar16]->addrlen,(char *)local_438,0x401,local_498,0x20,3
                           );
        if (uVar6 != 0) {
          pSVar19 = (SSL_CTX *)(ulong)uVar6;
          pcStackY_4e0 = run_loop;
          run_using_server_starter_cold_1();
          sVar1 = conf.num_listeners;
          lStackY_520.accept_ctx.libmemcached_receiver = (h2o_multithread_receiver_t *)0x23600c;
          listeners = &lStackY_520 + -conf.num_listeners;
          pphVar20 = (h2o_hostconf_t **)((long)pSVar19 * 0x3c8);
          paVar5 = conf.threads + (long)pSVar19;
          lStackY_520.accept_ctx.ssl_ctx = pSVar19;
          lStackY_520.accept_ctx._24_8_ = sVar16;
          lStackY_520.sock = local_438;
          pcStackY_4f0 = unaff_R14;
          plStackY_4e8 = plVar3;
          pcStackY_4e0 = (code *)local_498;
          (&uStackY_528)[conf.num_listeners * -6] = 0x18e36d;
          phVar13 = h2o_evloop_create();
          (&uStackY_528)[sVar1 * -6] = 0x18e37b;
          h2o_context_init(&paVar5->ctx,phVar13,&conf.globalconf);
          phVar4 = conf.threads[(long)pSVar19].ctx.queue;
          (&uStackY_528)[sVar1 * -6] = 0x18e3a0;
          h2o_multithread_register_receiver
                    (phVar4,&conf.threads[(long)pSVar19].server_notifications,on_server_notification
                    );
          phVar4 = conf.threads[(long)pSVar19].ctx.queue;
          (&uStackY_528)[sVar1 * -6] = 0x18e3c5;
          h2o_multithread_register_receiver
                    (phVar4,&conf.threads[(long)pSVar19].memcached,h2o_memcached_receiver);
          (&uStackY_528)[sVar1 * -6] = 0x18e3ca;
          pVar14 = pthread_self();
          conf.threads[(long)pSVar19].tid = pVar14;
          if (conf.num_listeners != 0) {
            sVar16 = 0;
            plVar17 = listeners;
            lStackY_520.accept_ctx.hosts = pphVar20;
            do {
              plVar3 = conf.listeners[sVar16];
              iVar7 = plVar3->fd;
              if (lStackY_520.accept_ctx.ssl_ctx != (SSL_CTX *)0x0) {
                (&uStackY_528)[sVar1 * -6] = 0x18e40b;
                iVar7 = dup(iVar7);
                if (iVar7 == -1) {
                  (&uStackY_528)[sVar1 * -6] = 0x18e5ed;
                  perror("failed to dup listening socket");
                  (&uStackY_528)[sVar1 * -6] = on_config_listen_enter;
                  abort();
                }
                (&uStackY_528)[sVar1 * -6] = 0x18e41e;
                set_cloexec(iVar7);
              }
              (plVar17->accept_ctx).libmemcached_receiver = (h2o_multithread_receiver_t *)0x0;
              plVar17->sock = (h2o_socket_t *)0x0;
              (plVar17->accept_ctx).ssl_ctx = (SSL_CTX *)0x0;
              *(undefined8 *)&(plVar17->accept_ctx).expect_proxy_line = 0;
              (plVar17->accept_ctx).ctx = (h2o_context_t *)0x0;
              (plVar17->accept_ctx).hosts = (h2o_hostconf_t **)0x0;
              phVar2 = (h2o_context_t *)
                       ((long)&((conf.threads)->ctx).loop + (long)lStackY_520.accept_ctx.hosts);
              (plVar17->accept_ctx).ctx = phVar2;
              (plVar17->accept_ctx).hosts = plVar3->hosts;
              pphVar20 = lStackY_520.accept_ctx.hosts;
              if ((plVar3->ssl).size != 0) {
                (plVar17->accept_ctx).ssl_ctx = (*(plVar3->ssl).entries)->ctx;
              }
              (plVar17->accept_ctx).expect_proxy_line = plVar3->proxy_protocol;
              (plVar17->accept_ctx).libmemcached_receiver =
                   (h2o_multithread_receiver_t *)
                   ((long)&((conf.threads)->memcached).queue + (long)lStackY_520.accept_ctx.hosts);
              phVar13 = phVar2->loop;
              (&uStackY_528)[sVar1 * -6] = 0x18e492;
              phVar15 = h2o_evloop_socket_create(phVar13,iVar7,0x20);
              plVar17->sock = phVar15;
              phVar15->data = plVar17;
              sVar16 = sVar16 + 1;
              plVar17 = plVar17 + 1;
            } while (sVar16 != conf.num_listeners);
          }
          (&uStackY_528)[sVar1 * -6] = 0x18e4b5;
          update_listener_state(listeners);
          (&uStackY_528)[sVar1 * -6] = 0x18e4c1;
          h2o_barrier_wait(&conf.startup_sync_barrier);
          while (conf.shutdown_requested == 0) {
            (&uStackY_528)[sVar1 * -6] = 0x18e4d2;
            update_listener_state(listeners);
            phVar13 = *(h2o_evloop_t **)((long)&((conf.threads)->ctx).loop + (long)pphVar20);
            (&uStackY_528)[sVar1 * -6] = 0x18e4e8;
            h2o_evloop_run(phVar13,0x7fffffff);
            cache = *(h2o_filecache_t **)
                     ((long)&((conf.threads)->ctx).loop + (long)(pphVar20 + 0x1b));
            (&uStackY_528)[sVar1 * -6] = 0x18e4fc;
            h2o_filecache_clear(cache);
          }
          if (lStackY_520.accept_ctx.ssl_ctx == (SSL_CTX *)0x0) {
            (&uStackY_528)[sVar1 * -6] = 0x18e525;
            fwrite("received SIGTERM, gracefully shutting down\n",0x2b,1,_stderr);
          }
          if (conf.num_listeners != 0) {
            pphVar18 = &(&lStackY_520)[-sVar1].sock;
            sVar16 = 0;
            do {
              phVar15 = *pphVar18;
              (&uStackY_528)[sVar1 * -6] = 0x18e53e;
              h2o_socket_read_stop(phVar15);
              sVar16 = sVar16 + 1;
              pphVar18 = pphVar18 + 6;
            } while (sVar16 != conf.num_listeners);
          }
          phVar13 = *(h2o_evloop_t **)((long)&((conf.threads)->ctx).loop + (long)pphVar20);
          (&uStackY_528)[sVar1 * -6] = 0x18e561;
          h2o_evloop_run(phVar13,0);
          if (conf.num_listeners != 0) {
            pphVar18 = &(&lStackY_520)[-sVar1].sock;
            sVar16 = 0;
            do {
              phVar15 = *pphVar18;
              (&uStackY_528)[sVar1 * -6] = 0x18e579;
              h2o_socket_close(phVar15);
              *pphVar18 = (h2o_socket_t *)0x0;
              sVar16 = sVar16 + 1;
              pphVar18 = pphVar18 + 6;
            } while (sVar16 != conf.num_listeners);
          }
          (&uStackY_528)[sVar1 * -6] = 0x18e5a4;
          h2o_context_request_shutdown
                    ((h2o_context_t *)((long)&((conf.threads)->ctx).loop + (long)pphVar20));
          while (conf.state._num_connections != 0) {
            phVar13 = *(h2o_evloop_t **)((long)&((conf.threads)->ctx).loop + (long)pphVar20);
            (&uStackY_528)[sVar1 * -6] = 0x18e5c7;
            h2o_evloop_run(phVar13,0x7fffffff);
          }
          if (conf.pid_file != (char *)0x0) {
            (&uStackY_528)[sVar1 * -6] = 0x18e5da;
            unlink(conf.pid_file);
          }
          (&uStackY_528)[sVar1 * -6] = 0x18e5e1;
          _exit(0);
        }
        pcStackY_4e0 = (code *)0x18e16e;
        sVar9 = strlen((char *)local_438);
        pcStackY_4e0 = (code *)0x18e179;
        sVar10 = strlen(local_498);
        pcStackY_4e0 = (code *)0x18e186;
        unaff_R14 = (char *)malloc(sVar9 + sVar10 + 0xb);
        if (unaff_R14 == (char *)0x0) goto LAB_0018e308;
        pcStackY_4e0 = (code *)0x18e19f;
        pcVar8 = strchr((char *)local_438,0x3a);
        pcVar12 = "--port=[%s]:%s";
        if (pcVar8 == (char *)0x0) {
          pcVar12 = "--port=%s:%s";
        }
        pcStackY_4e0 = (code *)0x18e1c0;
        sprintf(unaff_R14,pcVar12,local_438,local_498);
      }
      if (local_4c8.capacity < local_4c8.size + 1) {
        pcStackY_4e0 = (code *)0x18e1e0;
        h2o_vector__expand((h2o_mem_pool_t *)0x0,&local_4c8,8,local_4c8.size + 1);
      }
      sVar1 = local_4c8.size + 1;
      *(char **)((long)local_4c8.entries + local_4c8.size * 8) = unaff_R14;
      sVar16 = sVar16 + 1;
      local_4c8.size = sVar1;
    } while (sVar16 != conf.num_listeners);
  }
  if (local_4c8.capacity < local_4c8.size + 5) {
    pcStackY_4e0 = (code *)0x18e228;
    h2o_vector__expand((h2o_mem_pool_t *)0x0,&local_4c8,8,local_4c8.size + 5);
  }
  __argv = local_4c8.entries;
  *(char **)((long)local_4c8.entries + local_4c8.size * 8) = "--";
  *(char **)((long)local_4c8.entries + (local_4c8.size + 1) * 8) = local_4a8;
  *(char **)((long)local_4c8.entries + (local_4c8.size + 2) * 8) = "-c";
  *(char **)((long)local_4c8.entries + (local_4c8.size + 3) * 8) = local_4a0;
  *(char **)((long)local_4c8.entries + (local_4c8.size + 4) * 8) = (char *)0x0;
  pcStackY_4e0 = (code *)0x18e2bb;
  local_4c8.size = local_4c8.size + 4;
  setenv("H2O_VIA_MASTER","",1);
  pcStackY_4e0 = (code *)0x18e2c6;
  execvp(*__argv,(char **)__argv);
  __stream = _stderr;
  pcVar8 = *__argv;
  pcStackY_4e0 = (code *)0x18e2d8;
  piVar11 = __errno_location();
  pcStackY_4e0 = (code *)0x18e2df;
  pcVar12 = strerror(*piVar11);
  pcStackY_4e0 = (code *)0x18e2f6;
  iVar7 = fprintf(__stream,"failed to spawn %s:%s\n",pcVar8,pcVar12);
  return iVar7;
}

Assistant:

static int run_using_server_starter(const char *h2o_cmd, const char *config_file)
{
    char **args = build_server_starter_argv(h2o_cmd, config_file);
    setenv("H2O_VIA_MASTER", "", 1);
    execvp(args[0], args);
    fprintf(stderr, "failed to spawn %s:%s\n", args[0], strerror(errno));
    return EX_CONFIG;
}